

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Sit(Map *this,Character *from,SitState sit_type)

{
  Character *other;
  bool bVar1;
  int num;
  reference ppCVar2;
  PacketFamily family;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_50 [8];
  PacketBuilder builder;
  SitState sit_type_local;
  Character *from_local;
  Map *this_local;
  
  from->sitting = sit_type;
  builder.add_size._7_1_ = sit_type;
  Character::CancelSpell(from);
  family = PACKET_SIT;
  if (builder.add_size._7_1_ == SIT_CHAIR) {
    family = PACKET_CHAIR;
  }
  PacketBuilder::PacketBuilder((PacketBuilder *)local_50,family,PACKET_PLAYER,6);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_50,num);
  PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)from->x);
  PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)from->y);
  PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)from->direction);
  PacketBuilder::AddChar((PacketBuilder *)local_50,0);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar2 = std::_List_iterator<Character_*>::operator*(&__end1);
    other = *ppCVar2;
    if ((other != from) && (bVar1 = Character::InRange(from,other), bVar1)) {
      Character::Send(other,(PacketBuilder *)local_50);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  return;
}

Assistant:

void Map::Sit(Character *from, SitState sit_type)
{
	from->sitting = sit_type;

	from->CancelSpell();

	PacketBuilder builder((sit_type == SIT_CHAIR) ? PACKET_CHAIR : PACKET_SIT, PACKET_PLAYER, 6);
	builder.AddShort(from->PlayerID());
	builder.AddChar(from->x);
	builder.AddChar(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(0); // ?

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}